

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O0

int ftp_open(char *filename,int rwmode,int *handle)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char firstchar;
  int status;
  long len;
  char recbuf [1200];
  char errorstr [1200];
  int local_3c;
  FILE *pFStack_38;
  int sock;
  FILE *command;
  FILE *ftpfile;
  int *handle_local;
  char *pcStack_18;
  int rwmode_local;
  char *filename_local;
  
  closememfile = 0;
  closecommandfile = 0;
  closeftpfile = 0;
  ftpfile = (FILE *)handle;
  handle_local._4_4_ = rwmode;
  pcStack_18 = filename;
  if (rwmode != 0) {
    ffpmsg("Can\'t open ftp:// type file with READWRITE access");
    ffpmsg("Specify an outfile for r/w access (ftp_open)");
    return 0x68;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)env);
  if (iVar1 == 0) {
    signal(0xe,signal_handler);
    sVar2 = strlen(pcStack_18);
    if (sVar2 < 0x4ad) {
      alarm(net_timeout);
      iVar1 = ftp_open_network(pcStack_18,&command,(FILE **)&stack0xffffffffffffffc8,&local_3c);
      if (iVar1 == 0) {
        closeftpfile = closeftpfile + 1;
        closecommandfile = closecommandfile + 1;
        iVar1 = mem_create(pcStack_18,&ftpfile->_flags);
        if (iVar1 == 0) {
          closememfile = closememfile + 1;
          iVar1 = fgetc((FILE *)command);
          ungetc((int)(char)iVar1,(FILE *)command);
          pcVar3 = strstr(pcStack_18,".gz");
          if (((pcVar3 == (char *)0x0) && (pcVar3 = strstr(pcStack_18,".Z"), pcVar3 == (char *)0x0))
             && ((char)iVar1 != '\x1f')) {
            alarm(net_timeout);
            while (sVar2 = fread(&len,1,0x4b0,(FILE *)command), sVar2 != 0) {
              alarm(0);
              iVar1 = mem_write(ftpfile->_flags,&len,sVar2);
              if (iVar1 != 0) {
                ffpmsg("Error writing memory file (http_open)");
                ffpmsg(pcStack_18);
                goto LAB_0013efa8;
              }
              alarm(net_timeout);
            }
          }
          else {
            alarm(net_timeout * 10);
            iVar1 = mem_uncompress2mem(pcStack_18,command,ftpfile->_flags);
            alarm(0);
            if (iVar1 != 0) {
              ffpmsg("Error writing compressed memory file (ftp_open)");
              ffpmsg(pcStack_18);
              goto LAB_0013efa8;
            }
          }
          fclose((FILE *)command);
          closeftpfile = closeftpfile + -1;
          fclose(pFStack_38);
          NET_SendRaw(local_3c,"QUIT\r\n",6,0);
          closecommandfile = closecommandfile + -1;
          signal(0xe,(__sighandler_t)0x0);
          alarm(0);
          iVar1 = mem_seek(ftpfile->_flags,0);
          return iVar1;
        }
        ffpmsg("Could not create memory file to passive port (ftp_open)");
        ffpmsg(pcStack_18);
      }
      else {
        alarm(0);
        ffpmsg("Unable to open following ftp file (ftp_open):");
        ffpmsg(pcStack_18);
      }
    }
    else {
      ffpmsg("filename too long (ftp_open)");
      ffpmsg(pcStack_18);
    }
  }
  else {
    ffpmsg("Timeout (ftp_open)");
    snprintf(recbuf + 0x4a8,0x4b0,"Download timeout exceeded: %d seconds");
    ffpmsg(recbuf + 0x4a8);
    ffpmsg("   (multiplied x10 for files requiring uncompression)");
    ffpmsg("   Timeout may be adjusted with fits_set_timeout");
  }
LAB_0013efa8:
  alarm(0);
  if (closecommandfile != 0) {
    fclose(pFStack_38);
    NET_SendRaw(local_3c,"QUIT\r\n",6,0);
  }
  if (closeftpfile != 0) {
    fclose((FILE *)command);
  }
  if (closememfile != 0) {
    mem_close_free(ftpfile->_flags);
  }
  signal(0xe,(__sighandler_t)0x0);
  return 0x68;
}

Assistant:

int ftp_open(char *filename, int rwmode, int *handle)
{
  FILE *ftpfile;
  FILE *command;
  int sock;
  char errorstr[MAXLEN];
  char recbuf[MAXLEN];
  long len;
  int status;
  char firstchar;

  closememfile = 0;
  closecommandfile = 0;
  closeftpfile = 0;

  /* don't do r/w files */
  if (rwmode != 0) {
    ffpmsg("Can't open ftp:// type file with READWRITE access");
    ffpmsg("Specify an outfile for r/w access (ftp_open)");
    return (FILE_NOT_OPENED);
  }

  /* do the signal handler bits */
  if (setjmp(env) != 0) {
    /* feels like the second time */
    /* this means something bad happened */
    ffpmsg("Timeout (ftp_open)");
    snprintf(errorstr, MAXLEN, "Download timeout exceeded: %d seconds",net_timeout);
    ffpmsg(errorstr);
    ffpmsg("   (multiplied x10 for files requiring uncompression)");
    ffpmsg("   Timeout may be adjusted with fits_set_timeout");
    goto error;
  }

  signal(SIGALRM, signal_handler);
  
  /* Open the ftp connetion.  ftpfile is connected to the file port, 
     command is connected to port 21.  sock is the socket on port 21 */

  if (strlen(filename) > MAXLEN - 4) {
      ffpmsg("filename too long (ftp_open)");
      ffpmsg(filename);
      goto error;
  } 

  alarm(net_timeout);
  if (ftp_open_network(filename,&ftpfile,&command,&sock)) {

      alarm(0);
      ffpmsg("Unable to open following ftp file (ftp_open):");
      ffpmsg(filename);
      goto error;
  } 

  closeftpfile++;
  closecommandfile++;

  /* create the memory file */
  if ((status = mem_create(filename,handle))) {
    ffpmsg ("Could not create memory file to passive port (ftp_open)");
    ffpmsg(filename);
    goto error;
  }
  closememfile++;
  /* This isn't quite right, it'll fail if the file has .gzabc at the end
     for instance */

  /* Decide if the file is compressed */
  firstchar = fgetc(ftpfile);
  ungetc(firstchar,ftpfile);

  if (strstr(filename,".gz") || 
      strstr(filename,".Z") ||
      ('\037' == firstchar)) {
    
    status = 0;
    /* A bit arbritary really, the user will probably hit ^C */
    alarm(net_timeout*10);
    status = mem_uncompress2mem(filename, ftpfile, *handle);
    alarm(0);
    if (status) {
      ffpmsg("Error writing compressed memory file (ftp_open)");
      ffpmsg(filename);
      goto error;
    }
  } else {
    /* write a memory file */
    alarm(net_timeout);
    while(0 != (len = fread(recbuf,1,MAXLEN,ftpfile))) {
      alarm(0);
      status = mem_write(*handle,recbuf,len);
      if (status) {
	ffpmsg("Error writing memory file (http_open)");
        ffpmsg(filename);
	goto error;
      }
      alarm(net_timeout);
    }
  }

  /* close and clean up */
  fclose(ftpfile);
  closeftpfile--;

  fclose(command);
  NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
  closecommandfile--;

  signal(SIGALRM, SIG_DFL);
  alarm(0);

  return mem_seek(*handle,0);

 error:
  alarm(0); /* clear it */
  if (closecommandfile) {
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
  }
  if (closeftpfile) {
    fclose(ftpfile);
  }
  if (closememfile) {
    mem_close_free(*handle);
  }
  
  signal(SIGALRM, SIG_DFL);
  return (FILE_NOT_OPENED);
}